

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verifySize.hpp
# Opt level: O1

void njoy::ENDFtk::section::Type<2,_151>::
     LJValueType<njoy::ENDFtk::section::Type<2,_151>::UnresolvedEnergyIndependent,_void>::LValue::
     verifySize(int NPL,int NJS)

{
  undefined8 *puVar1;
  
  if (NJS * 6 == NPL) {
    return;
  }
  tools::Log::error<char_const*>("Encountered inconsistent list size");
  tools::Log::info<char_const*>("NPL must be equal to 6 * NJS");
  tools::Log::info<char_const*,int>("NPL value: {}",NPL);
  tools::Log::info<char_const*,int>("NJS value: {}",NJS);
  puVar1 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar1 = getenv;
  __cxa_throw(puVar1,&std::exception::typeinfo,std::exception::~exception);
}

Assistant:

static void
verifySize( int NPL, int NJS ) {

  if ( NPL != 6 * NJS ) {

    Log::error( "Encountered inconsistent list size" );
    Log::info( "NPL must be equal to 6 * NJS" );
    Log::info( "NPL value: {}", NPL );
    Log::info( "NJS value: {}", NJS );
    throw std::exception();
  }
}